

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O3

Float __thiscall
pbrt::FloatCheckerboardTexture::Evaluate(FloatCheckerboardTexture *this,TextureEvalContext ctx)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  DispatchSplit<12> local_79;
  Float local_78;
  uint local_74;
  TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  local_70;
  TaggedPointer<pbrt::TransformMapping3D> local_68;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  local_60;
  Tuple3<pbrt::Point3,_float> local_58 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_40 [4];
  undefined1 extraout_var [60];
  
  local_60.bits =
       (this->map2D).
       super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
       .bits;
  local_68.bits = (this->map3D).super_TaggedPointer<pbrt::TransformMapping3D>.bits;
  local_78 = Checkerboard(ctx,(TextureMapping2DHandle *)&local_60,
                          (TextureMapping3DHandle *)&local_68);
  auVar2 = ZEXT816(0) << 0x40;
  if ((local_78 != 1.0) || (NAN(local_78))) {
    local_58[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
    local_58[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
    local_58[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
    local_58[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
    local_58[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_58[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_40[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    aTStack_40[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    aTStack_40[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_40[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
    aTStack_40[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
    aTStack_40[1].z = ctx.dudx;
    aTStack_40[2].x = ctx.dudy;
    aTStack_40[2].y = ctx.dvdx;
    aTStack_40[2].z = ctx.dvdy;
    aTStack_40[3].x = (float)ctx.faceIndex;
    local_70.bits =
         this->tex[0].
         super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
         .bits;
    auVar3._0_4_ = DispatchSplit<12>::operator()(&local_79,local_58,&local_70,local_70.bits >> 0x30)
    ;
    auVar3._4_60_ = extraout_var;
    auVar2 = auVar3._0_16_;
  }
  fVar1 = 0.0;
  if ((local_78 != 0.0) || (NAN(local_78))) {
    local_74 = auVar2._0_4_;
    local_58[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
    local_58[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
    local_58[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
    local_58[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
    local_58[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_58[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_40[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    aTStack_40[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    aTStack_40[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_40[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
    aTStack_40[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
    aTStack_40[1].z = ctx.dudx;
    aTStack_40[2].x = ctx.dudy;
    aTStack_40[2].y = ctx.dvdx;
    aTStack_40[2].z = ctx.dvdy;
    aTStack_40[3].x = (float)ctx.faceIndex;
    local_70.bits =
         this->tex[1].
         super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
         .bits;
    fVar1 = DispatchSplit<12>::operator()(&local_79,local_58,&local_70,local_70.bits >> 0x30);
    auVar2 = ZEXT416(local_74);
  }
  auVar2 = vfmadd213ss_fma(auVar2,ZEXT416((uint)(1.0 - local_78)),ZEXT416((uint)(local_78 * fVar1)))
  ;
  return auVar2._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float Evaluate(TextureEvalContext ctx) const {
        Float w = Checkerboard(ctx, map2D, map3D);
        Float t0 = 0, t1 = 0;
        if (w != 1)
            t0 = tex[0].Evaluate(ctx);
        if (w != 0)
            t1 = tex[1].Evaluate(ctx);
        return (1 - w) * t0 + w * t1;
    }